

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::ActiveTipChange(ValidationSignals *this,CBlockIndex *new_tip,bool is_ibd)

{
  long lVar1;
  bool bVar2;
  LogFlags in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  Level in_stack_000000b0;
  char (*in_stack_000000c0) [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c8;
  int *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  base_blob<256U> *in_stack_ffffffffffffff10;
  CBlockIndex *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  anon_class_16_2_d3e01511 *in_stack_ffffffffffffff38;
  ValidationSignalsImpl *in_stack_ffffffffffffff40;
  int source_line;
  ConstevalFormatString<3U> in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffd0;
  
  source_line = (int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff38 = (anon_class_16_2_d3e01511 *)&stack0xffffffffffffffb8;
    CBlockIndex::GetBlockHash(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff40 = (ValidationSignalsImpl *)&stack0xffffffffffffffd8;
    base_blob<256u>::ToString_abi_cxx11_(in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff08 = 1;
    LogPrintFormatInternal<char[16],std::__cxx11::string,int>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0,source_line,in_RSI,
               in_stack_000000b0,in_stack_ffffffffffffffb8,in_stack_000000c0,in_stack_000000c8,
               in_stack_000000d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  ValidationSignalsImpl::Iterate<ValidationSignals::ActiveTipChange(CBlockIndex_const&,bool)::__0>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::ActiveTipChange(const CBlockIndex& new_tip, bool is_ibd)
{
    LOG_EVENT("%s: new block hash=%s block height=%d", __func__, new_tip.GetBlockHash().ToString(), new_tip.nHeight);
    m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.ActiveTipChange(new_tip, is_ibd); });
}